

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeDSK.cpp
# Opt level: O2

int __thiscall
FormatTypeDSK::LoadDisk
          (FormatTypeDSK *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  Side *pSVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  Track *pTVar5;
  IDisk *this_00;
  void *pvVar6;
  Sector *pSVar7;
  void *__dest;
  MFMTrack *pMVar8;
  undefined8 *puVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int side;
  long lVar18;
  ulong uVar19;
  uint local_88;
  uint local_70;
  
  if (*(long *)buffer == 0x435043202d20564d) {
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    bVar13 = 2;
    if (buffer[0x31] < 2) {
      bVar13 = buffer[0x31];
    }
    bVar2 = buffer[0x30];
    this_00->nb_sides_ = bVar13;
    uVar4 = *(ushort *)(buffer + 0x32);
    for (lVar18 = 0; (ulong)bVar13 << 4 != lVar18; lVar18 = lVar18 + 0x10) {
      (&this->side_[0].nb_tracks)[lVar18] = bVar2;
      pvVar6 = operator_new__((ulong)bVar2 * 0x28);
      *(void **)((long)&this->side_[0].tracks + lVar18) = pvVar6;
      memset(pvVar6,0,(ulong)bVar2 * 0x28);
    }
    uVar16 = (ulong)uVar4 - 0x100;
    pvVar6 = operator_new__(uVar16);
    iVar10 = 0x100;
    for (uVar12 = 0; local_88 = (uint)bVar2, uVar12 < bVar13 * local_88; uVar12 = uVar12 + 1) {
      bVar13 = buffer[(long)iVar10 + 0x11];
      memcpy(pvVar6,buffer + (long)iVar10 + 0x100,uVar16);
      bVar3 = this->side_[bVar13].nb_tracks;
      uVar11 = bVar3 - 1;
      if (buffer[(long)iVar10 + 0x10] < bVar3) {
        uVar11 = (uint)buffer[(long)iVar10 + 0x10];
      }
      bVar3 = buffer[(long)iVar10 + 0x14];
      pTVar5 = this->side_[bVar13].tracks;
      pTVar5[uVar11].sz = bVar3;
      pTVar5[uVar11].sector_size = 0x80 << (bVar3 & 0x1f);
      bVar13 = buffer[(long)iVar10 + 0x15];
      pTVar5[uVar11].nb_sector = (uint)bVar13;
      pTVar5[uVar11].gap3 = buffer[(long)iVar10 + 0x16];
      pTVar5[uVar11].gap3_filter = 'N';
      pSVar7 = (Sector *)operator_new__((ulong)bVar13 * 0x18);
      pTVar5[uVar11].sectors = pSVar7;
      uVar17 = (ulong)pTVar5[uVar11].nb_sector;
      uVar15 = 0x1d;
      for (lVar18 = 0; uVar17 * 3 != lVar18; lVar18 = lVar18 + 3) {
        *(undefined4 *)(&pSVar7->track + lVar18 * 8) =
             *(undefined4 *)(buffer + (ulong)(uVar15 - 5) + (long)iVar10);
        (&pSVar7->fdc_status_1)[lVar18 * 8] = buffer[(ulong)(uVar15 - 1) + (long)iVar10];
        (&pSVar7->fdc_status_2)[lVar18 * 8] = buffer[(ulong)uVar15 + (long)iVar10];
        (&pSVar7->actual_size)[lVar18 * 4] = (unsigned_short)pTVar5[uVar11].sector_size;
        uVar15 = uVar15 + 8;
      }
      lVar18 = 0x10;
      uVar19 = 0;
      for (uVar14 = 0; uVar14 < uVar17; uVar14 = uVar14 + 1) {
        __dest = operator_new__((ulong)pTVar5[uVar11].sector_size);
        *(void **)(&(pTVar5[uVar11].sectors)->track + lVar18) = __dest;
        memcpy(__dest,(void *)(uVar19 + (long)pvVar6),(ulong)pTVar5[uVar11].sector_size);
        uVar19 = (ulong)((int)uVar19 + pTVar5[uVar11].sector_size);
        uVar17 = (ulong)pTVar5[uVar11].nb_sector;
        lVar18 = lVar18 + 0x18;
      }
      local_70 = (uint)uVar4;
      iVar10 = iVar10 + local_70;
      bVar13 = this_00->nb_sides_;
    }
    operator_delete__(pvVar6);
    for (uVar16 = 0; uVar16 < this_00->nb_sides_; uVar16 = uVar16 + 1) {
      bVar13 = this->side_[uVar16].nb_tracks;
      uVar12 = (uint)bVar13;
      uVar17 = (ulong)bVar13 << 5;
      if (bVar13 < 0x2a) {
        uVar17 = 0x540;
      }
      pMVar8 = (MFMTrack *)operator_new__(uVar17);
      pSVar1 = this_00->side_ + uVar16;
      this_00->side_[uVar16].tracks = pMVar8;
      this_00->side_[uVar16].nb_tracks = uVar12;
      lVar18 = 0;
      for (uVar17 = 0; uVar17 < uVar12; uVar17 = uVar17 + 1) {
        pMVar8 = pSVar1->tracks;
        *(undefined4 *)((long)&pMVar8->nb_revolutions + lVar18) = 1;
        puVar9 = (undefined8 *)operator_new__(0x38);
        *puVar9 = 1;
        puVar9[5] = 0;
        puVar9[3] = 0;
        puVar9[4] = 0;
        *(undefined8 **)((long)&pMVar8->revolution + lVar18) = puVar9 + 1;
        uVar12 = FillTrack(this,(uchar *)0x0,(int)uVar16,(int)uVar17);
        pMVar8 = pSVar1->tracks;
        *(uint *)(*(long *)((long)&pMVar8->revolution + lVar18) + 8) = uVar12;
        if (uVar12 < 0x40000) {
          uVar14 = 0x40000;
        }
        else {
          uVar14 = (ulong)uVar12;
        }
        pvVar6 = operator_new__(uVar14);
        puVar9 = *(undefined8 **)((long)&pMVar8->revolution + lVar18);
        *puVar9 = pvVar6;
        memset(pvVar6,0,(ulong)*(uint *)(puVar9 + 1));
        FillTrack(this,(uchar *)**(undefined8 **)((long)&pMVar8->revolution + lVar18),(int)uVar16,
                  (int)uVar17);
        uVar12 = pSVar1->nb_tracks;
        lVar18 = lVar18 + 0x20;
      }
      if (uVar12 < 0x2a) {
        for (lVar18 = (ulong)uVar12 << 5; lVar18 != 0x540; lVar18 = lVar18 + 0x20) {
          pMVar8 = pSVar1->tracks;
          *(undefined4 *)((long)&pMVar8->nb_revolutions + lVar18) = 1;
          puVar9 = (undefined8 *)operator_new__(0x38);
          *puVar9 = 1;
          puVar9[5] = 0;
          puVar9[3] = 0;
          puVar9[4] = 0;
          *(undefined8 **)((long)&pMVar8->revolution + lVar18) = puVar9 + 1;
          *(undefined4 *)(puVar9 + 2) = 0x40000;
          pvVar6 = operator_new__(0x40000);
          **(undefined8 **)((long)&pMVar8->revolution + lVar18) = pvVar6;
          memset(pvVar6,0,0x40000);
        }
      }
    }
    (*this_00->_vptr_IDisk[0x14])(this_00);
    *created_disk = this_00;
    iVar10 = 0;
  }
  else {
    iVar10 = -1;
  }
  return iVar10;
}

Assistant:

int FormatTypeDSK::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                            ILoadingProgress* loading_progress)
{
   if (memcmp(buffer, "MV - CPC", 8) == 0)
   {
      IDisk* new_disk = new IDisk();

      // Name of creator : don't read
      // Number of tracks, and sides
      int nb_tracks = buffer[0x30];
      new_disk->nb_sides_ = buffer[0x31];

      if (new_disk->nb_sides_ > 2)
      {
         // ERROR ! Handle or correct ?
         new_disk->nb_sides_ = 2;
      }

      // Size of tracks
      int size_of_track = (buffer[0x32] + ((buffer[0x33]) << 8)) - 0x100;
      //m_NbSide = m_NbSide;

      // Format disk on memory
      int i, j;
      unsigned int k;
      for (i = 0; i < new_disk->nb_sides_; i++)
      {
         side_[i].nb_tracks = nb_tracks;
         side_[i].tracks = new Track[side_[i].nb_tracks];
         memset(side_[i].tracks, 0, sizeof(Track) * side_[i].nb_tracks);
      }


      // Read the tracks
      unsigned char* track_block = new unsigned char[size_of_track];

      int index_buffer = 0x100;
      for (j = 0; j < nb_tracks * new_disk->nb_sides_; j++)
      {
         const unsigned char* header = &buffer[index_buffer];
         index_buffer += 0x100;

         //fread(header, 0x100, 1, file);
         // Side number
         i = header[0x11];

         //fread(TrackBlock, m_SizeOfTrack, 1, file);
         memcpy(track_block, &buffer[index_buffer], size_of_track);
         index_buffer += size_of_track;
         // Track number
         unsigned int tn = header[0x10];
         if (tn >= side_[i].nb_tracks)
         {
            // bug...
            tn = side_[i].nb_tracks - 1;
         }
         unsigned char sector_size = side_[i].tracks[tn].sz = header[0x14];
         //SZ = sectorSize_L;
         side_[i].tracks[tn].sector_size = (0x80 << sector_size);
         // Number of sector
         side_[i].tracks[tn].nb_sector = header[0x15];
         side_[i].tracks[tn].gap3 = header[0x16];
         side_[i].tracks[tn].gap3_filter = 0x4E; // header [0x17];
         side_[i].tracks[tn].sectors = new Sector[side_[i].tracks[tn].nb_sector];
         // Sector info
         for (k = 0; k < side_[i].tracks[tn].nb_sector; k++)
         {
            side_[i].tracks[tn].sectors[k].track = header[0x18 + k * 8 + 00];
            side_[i].tracks[tn].sectors[k].side = header[0x18 + k * 8 + 01];
            side_[i].tracks[tn].sectors[k].sector_id = header[0x18 + k * 8 + 02];
            side_[i].tracks[tn].sectors[k].sector_size = header[0x18 + k * 8 + 03];
            side_[i].tracks[tn].sectors[k].fdc_status_1 = header[0x18 + k * 8 + 04];
            side_[i].tracks[tn].sectors[k].fdc_status_2 = header[0x18 + k * 8 + 05];

            side_[i].tracks[tn].sectors[k].actual_size = side_[i].tracks[tn].sector_size;
         }

         // Data
         unsigned int offset = 0;
         for (k = 0; k < side_[i].tracks[tn].nb_sector; k++)
         {
            side_[i].tracks[tn].sectors[k].data = new unsigned char[side_[i].tracks[tn].sector_size];
            memcpy(side_[i].tracks[tn].sectors[k].data, &track_block[offset], side_[i].tracks[tn].sector_size);
            offset += side_[i].tracks[tn].sector_size;
         }
      }
      delete[]track_block;

      // Fill the MFM structure
      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         new_disk->side_[side].tracks = new IDisk::MFMTrack[side_[side].nb_tracks < 42 ? 42 : side_[side].nb_tracks];
         new_disk->side_[side].nb_tracks = side_[side].nb_tracks;

         for (unsigned int track = 0; track < new_disk->side_[side].nb_tracks; track++)
         {
            // Init space
            new_disk->side_[side].tracks[track].nb_revolutions = 1; // Only one for DSK files
            new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[1];

            new_disk->side_[side].tracks[track].revolution[0].size = FillTrack(NULL, side, track);
            if (new_disk->side_[side].tracks[track].revolution[0].size < DEFAULT_TRACK_SIZE * 16)
            {
               new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[DEFAULT_TRACK_SIZE * 16];
            }
            else
            {
               new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[new_disk->side_[side].
                  tracks[track].revolution[0].size];
            }
            memset(new_disk->side_[side].tracks[track].revolution[0].bitfield, 0,
                   new_disk->side_[side].tracks[track].revolution[0].size);

            FillTrack(new_disk->side_[side].tracks[track].revolution[0].bitfield, side, track);
         }
         if (new_disk->side_[side].nb_tracks < 42)
         {
            for (unsigned int track = new_disk->side_[side].nb_tracks; track < 42; track++)
            {
               new_disk->side_[side].tracks[track].nb_revolutions = 1; // Only one for DSK files
               new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[1];

               new_disk->side_[side].tracks[track].revolution[0].size = DEFAULT_TRACK_SIZE * 16;
               new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[new_disk->side_[side].
                  tracks[track].revolution[0].size];
               memset(new_disk->side_[side].tracks[track].revolution[0].bitfield, 0, DEFAULT_TRACK_SIZE * 16);
            }
         }
      }
      new_disk->CreateTrackFromMultiRevolutions();

      created_disk = new_disk;

      return OK;
   }
   return FILE_ERROR;
}